

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

size_t __thiscall RPCHelpMan::GetParamIndex(RPCHelpMan *this,string_view key)

{
  pointer pRVar1;
  bool bVar2;
  __normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_> __it;
  long lVar3;
  long lVar4;
  _Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::__0>
  *this_00;
  pointer pRVar5;
  pointer pRVar6;
  long in_FS_OFFSET;
  bool local_39;
  long local_38;
  
  __it._M_current = (RPCArg *)key._M_str;
  this_00 = (_Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::__0>
             *)key._M_len;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pRVar6 = (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
           super__Vector_impl_data._M_start;
  pRVar1 = (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar3 = (long)pRVar1 - (long)pRVar6;
  lVar4 = (lVar3 >> 3) * 0xf83e0f83e0f83e1 >> 2;
  if (0 < lVar4) {
    lVar4 = lVar4 + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::$_0>
              ::operator()(this_00,__it);
      pRVar5 = pRVar6;
      if (bVar2) goto LAB_00379931;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::$_0>
              ::operator()(this_00,__it);
      pRVar5 = pRVar6 + 1;
      if (bVar2) goto LAB_00379931;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::$_0>
              ::operator()(this_00,__it);
      pRVar5 = pRVar6 + 2;
      if (bVar2) goto LAB_00379931;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::$_0>
              ::operator()(this_00,__it);
      pRVar5 = pRVar6 + 3;
      if (bVar2) goto LAB_00379931;
      pRVar6 = pRVar6 + 4;
      lVar4 = lVar4 + -1;
      lVar3 = lVar3 + -0x420;
    } while (1 < lVar4);
  }
  lVar3 = (lVar3 >> 3) * 0xf83e0f83e0f83e1;
  if (lVar3 != 1) {
    pRVar5 = pRVar6;
    if (lVar3 != 2) {
      pRVar5 = pRVar1;
      if ((lVar3 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::$_0>
                  ::operator()(this_00,__it), pRVar5 = pRVar6, bVar2)) goto LAB_00379931;
      pRVar5 = pRVar6 + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::$_0>
            ::operator()(this_00,__it);
    if (bVar2) goto LAB_00379931;
    pRVar6 = pRVar5 + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::$_0>
          ::operator()(this_00,__it);
  pRVar5 = pRVar1;
  if (bVar2) {
    pRVar5 = pRVar6;
  }
LAB_00379931:
  local_39 = pRVar5 != (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                       super__Vector_impl_data._M_finish;
  inline_check_non_fatal<bool>
            (&local_39,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/util.cpp"
             ,0x305,"GetParamIndex","it != m_args.end()");
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return ((long)pRVar5 -
          (long)(this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                super__Vector_impl_data._M_start >> 3) * 0xf83e0f83e0f83e1;
}

Assistant:

size_t RPCHelpMan::GetParamIndex(std::string_view key) const
{
    auto it{std::find_if(
        m_args.begin(), m_args.end(), [&key](const auto& arg) { return arg.GetName() == key;}
    )};

    CHECK_NONFATAL(it != m_args.end());  // TODO: ideally this is checked at compile time
    return std::distance(m_args.begin(), it);
}